

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void comment_cb(Fl_Text_Editor *i,void *v)

{
  bool bVar1;
  Fl_Text_Buffer *pFVar2;
  char *c_00;
  char *pcVar3;
  Fl_Window *pFVar4;
  char *local_50;
  Fl_Type *local_40;
  Fl_Type *o;
  char *d;
  char *c;
  int mod;
  char *cmttext;
  void *v_local;
  Fl_Text_Editor *i_local;
  
  if ((char *)v == "LOAD") {
    local_50 = Fl_Type::comment(&current_widget->super_Fl_Type);
    pFVar2 = Fl_Text_Display::buffer(&i->super_Fl_Text_Display);
    if (local_50 == (char *)0x0) {
      local_50 = "";
    }
    Fl_Text_Buffer::text(pFVar2,local_50);
  }
  else {
    bVar1 = false;
    pFVar2 = Fl_Text_Display::buffer(&i->super_Fl_Text_Display);
    c_00 = Fl_Text_Buffer::text(pFVar2);
    pcVar3 = c_check(c_00,0);
    if (pcVar3 != (char *)0x0) {
      fl_message("Error in comment: %s",pcVar3);
      pFVar4 = Fl_Widget::window((Fl_Widget *)i);
      if (pFVar4 != (Fl_Window *)0x0) {
        pFVar4 = Fl_Widget::window((Fl_Widget *)i);
        Fl_Window::make_current(pFVar4);
      }
      haderror = 1;
    }
    for (local_40 = Fl_Type::first; local_40 != (Fl_Type *)0x0; local_40 = local_40->next) {
      if (local_40->selected != '\0') {
        Fl_Type::comment(local_40,c_00);
        bVar1 = true;
      }
    }
    if (bVar1) {
      set_modflag(1);
    }
    free(c_00);
  }
  return;
}

Assistant:

void comment_cb(Fl_Text_Editor* i, void *v) {
  if (v == LOAD) {
    const char *cmttext = current_widget->comment();
    i->buffer()->text( cmttext ? cmttext : "" );
  } else {
    int mod = 0;
    char *c = i->buffer()->text();
    const char *d = c_check(c);
    if (d) {
      fl_message("Error in comment: %s",d);
      if (i->window()) i->window()->make_current();
      haderror = 1;
    }
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected) {
        o->comment(c);
        mod = 1;
      }
    }
    if (mod) set_modflag(1);
    free(c);
  }
}